

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExport.c
# Opt level: O2

int Cudd_DumpFactoredForm(DdManager *dd,int n,DdNode **f,char **inames,char **onames,FILE *fp)

{
  DdNode *pDVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  
  uVar2 = n;
  if (n < 1) {
    uVar2 = 0;
  }
  uVar5 = 0;
  do {
    if (uVar2 == uVar5) {
      return 1;
    }
    if (onames == (char **)0x0) {
      iVar3 = fprintf((FILE *)fp,"f%d = ",uVar5 & 0xffffffff);
    }
    else {
      iVar3 = fprintf((FILE *)fp,"%s = ",onames[uVar5]);
    }
    if (iVar3 == -1) {
      return 0;
    }
    pDVar1 = f[uVar5];
    if (pDVar1 == dd->one) {
      pcVar4 = "CONST1";
LAB_0065462d:
      iVar3 = fprintf((FILE *)fp,pcVar4);
    }
    else {
      if ((pDVar1 == (DdNode *)((ulong)dd->one ^ 1)) || (pDVar1 == dd->zero)) {
        pcVar4 = "CONST0";
        goto LAB_0065462d;
      }
      pcVar4 = "!(";
      if (((ulong)pDVar1 & 1) == 0) {
        pcVar4 = "";
      }
      iVar3 = fprintf((FILE *)fp,"%s",pcVar4);
      if (iVar3 == -1) {
        return 0;
      }
      iVar3 = ddDoDumpFactoredForm(dd,(DdNode *)((ulong)f[uVar5] & 0xfffffffffffffffe),fp,inames);
      if (iVar3 == 0) {
        return 0;
      }
      pcVar4 = ")";
      if (((ulong)f[uVar5] & 1) == 0) {
        pcVar4 = "";
      }
      iVar3 = fprintf((FILE *)fp,"%s",pcVar4);
    }
    if (iVar3 == -1) {
      return 0;
    }
    pcVar4 = "\n";
    if (n - 1 == uVar5) {
      pcVar4 = "";
    }
    iVar3 = fprintf((FILE *)fp,"%s",pcVar4);
    uVar5 = uVar5 + 1;
    if (iVar3 == -1) {
      return 0;
    }
  } while( true );
}

Assistant:

int
Cudd_DumpFactoredForm(
  DdManager * dd /* manager */,
  int  n /* number of output nodes to be dumped */,
  DdNode ** f /* array of output nodes to be dumped */,
  char ** inames /* array of input names (or NULL) */,
  char ** onames /* array of output names (or NULL) */,
  FILE * fp /* pointer to the dump file */)
{
    int         retval;
    int         i;

    /* Call the function that really gets the job done. */
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp, "f%d = ", i);
        } else {
            retval = fprintf(fp, "%s = ", onames[i]);
        }
        if (retval == EOF) return(0);
        if (f[i] == DD_ONE(dd)) {
            retval = fprintf(fp, "CONST1");
            if (retval == EOF) return(0);
        } else if (f[i] == Cudd_Not(DD_ONE(dd)) || f[i] == DD_ZERO(dd)) {
            retval = fprintf(fp, "CONST0");
            if (retval == EOF) return(0);
        } else {
            retval = fprintf(fp, "%s", Cudd_IsComplement(f[i]) ? "!(" : "");
            if (retval == EOF) return(0);
            retval = ddDoDumpFactoredForm(dd,Cudd_Regular(f[i]),fp,inames);
            if (retval == 0) return(0);
            retval = fprintf(fp, "%s", Cudd_IsComplement(f[i]) ? ")" : "");
            if (retval == EOF) return(0);
        }
        retval = fprintf(fp, "%s", i == n-1 ? "" : "\n");
        if (retval == EOF) return(0);
    }

    return(1);

}